

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::intersect_metrics_dim<2>(Omega_h *this,Reals *a,Reals *b)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_118;
  undefined1 local_108 [8];
  type f;
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  Write<double> c;
  int n;
  Reals *b_local;
  Reals *a_local;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  c.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_10 >> 3),3);
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_20 >> 3) == (int)(local_30 >> 3)) {
    size_in = c.shared_alloc_.direct_ptr._4_4_ * 3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"",&local_c1);
    Write<double>::Write((Write<double> *)local_a0,size_in,(string *)local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    Read<double>::Read((Read<double> *)local_108,a);
    Read<double>::Read((Read<double> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    Write<double>::Write
              ((Write<double> *)&f.b.write_.shared_alloc_.direct_ptr,(Write<double> *)local_a0);
    parallel_for<Omega_h::intersect_metrics_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (c.shared_alloc_.direct_ptr._4_4_,(type *)local_108,"intersect_metrics");
    Write<double>::Write(&local_118,(Write<signed_char> *)local_a0);
    Read<double>::Read((Read<double> *)this,&local_118);
    Write<double>::~Write(&local_118);
    intersect_metrics_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)local_108);
    Write<double>::~Write((Write<double> *)local_a0);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
       ,0x21a);
}

Assistant:

Reals intersect_metrics_dim(Reals a, Reals b) {
  auto n = divide_no_remainder(a.size(), symm_ncomps(dim));
  OMEGA_H_CHECK(a.size() == b.size());
  auto c = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto am = get_symm<dim>(a, i);
    auto bm = get_symm<dim>(b, i);
    auto cm = intersect_metrics(am, bm);
    set_symm(c, i, cm);
  };
  parallel_for(n, f, "intersect_metrics");
  return c;
}